

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

iterator * __thiscall Catch::TextFlow::Column::iterator::operator++(iterator *this)

{
  Column *pCVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = this->m_pos + this->m_len;
  pCVar1 = this->m_column;
  this->m_pos = uVar3;
  uVar2 = (pCVar1->m_string)._M_string_length;
  if ((uVar3 < uVar2) && ((pCVar1->m_string)._M_dataplus._M_p[uVar3] == '\n')) {
    uVar3 = uVar3 + 1;
    this->m_pos = uVar3;
  }
  else {
    while ((uVar3 < uVar2 &&
           ((uVar4 = (ulong)(byte)(pCVar1->m_string)._M_dataplus._M_p[uVar3], uVar4 < 0x21 &&
            ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))))) {
      uVar3 = uVar3 + 1;
      this->m_pos = uVar3;
    }
  }
  if (uVar3 != uVar2) {
    calcLength(this);
  }
  return this;
}

Assistant:

Column::iterator &Column::iterator::operator++() {
            m_pos += m_len;
            std::string const &current_line = m_column.m_string;
            if (m_pos < current_line.size() && current_line[m_pos] == '\n') {
                m_pos += 1;
            }
            else {
                while (m_pos < current_line.size() &&
                    isWhitespace(current_line[m_pos])) {
                    ++m_pos;
                }
            }

            if (m_pos != current_line.size()) {
                calcLength();
            }
            return *this;
        }